

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O0

bool google::protobuf::internal::WireFormatLite::
     ReadRepeatedPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
               (int param_1,uint32 tag,CodedInputStream *input,RepeatedField<bool> *values)

{
  RepeatedField<bool> *this;
  bool bVar1;
  int iVar2;
  char local_45;
  int local_40;
  bool local_39;
  int elements_already_reserved;
  bool value;
  RepeatedField<bool> *values_local;
  CodedInputStream *input_local;
  uint32 tag_local;
  int param_0_local;
  RepeatedField<bool> *local_18;
  char local_9;
  
  _elements_already_reserved = values;
  values_local = (RepeatedField<bool> *)input;
  input_local._0_4_ = tag;
  input_local._4_4_ = param_1;
  bVar1 = ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                    (input,&local_39);
  if (bVar1) {
    RepeatedField<bool>::Add(_elements_already_reserved,&local_39);
    local_40 = RepeatedField<bool>::Capacity(_elements_already_reserved);
    iVar2 = RepeatedField<bool>::size(_elements_already_reserved);
    local_40 = local_40 - iVar2;
    while( true ) {
      this = values_local;
      local_45 = '\0';
      if (0 < local_40) {
        local_18 = values_local;
        param_0_local = (uint32)input_local;
        if ((uint32)input_local < 0x80) {
          if ((*(Rep **)values_local < values_local->rep_) &&
             (**(byte **)values_local == (uint32)input_local)) {
            io::CodedInputStream::Advance((CodedInputStream *)values_local,1);
            local_9 = '\x01';
          }
          else {
            local_9 = '\0';
          }
        }
        else if ((uint32)input_local < 0x4000) {
          iVar2 = io::CodedInputStream::BufferSize((CodedInputStream *)values_local);
          if (((iVar2 < 2) || ((uint)**(byte **)this != (param_0_local & 0xffU | 0x80))) ||
             ((uint)*(byte *)(*(long *)this + 1) != ((uint)param_0_local >> 7 & 0xff))) {
            local_9 = '\0';
          }
          else {
            io::CodedInputStream::Advance((CodedInputStream *)this,2);
            local_9 = '\x01';
          }
        }
        else {
          local_9 = '\0';
        }
        local_45 = local_9;
      }
      if (local_45 == '\0') {
        return true;
      }
      bVar1 = ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                        ((CodedInputStream *)values_local,&local_39);
      if (!bVar1) break;
      RepeatedField<bool>::AddAlreadyReserved(_elements_already_reserved,&local_39);
      local_40 = local_40 + -1;
    }
  }
  return false;
}

Assistant:

inline bool WireFormatLite::ReadRepeatedPrimitive(
    int,  // tag_size, unused.
    uint32 tag,
    io::CodedInputStream* input,
    RepeatedField<CType>* values) {
  CType value;
  if (!ReadPrimitive<CType, DeclaredType>(input, &value)) return false;
  values->Add(value);
  int elements_already_reserved = values->Capacity() - values->size();
  while (elements_already_reserved > 0 && input->ExpectTag(tag)) {
    if (!ReadPrimitive<CType, DeclaredType>(input, &value)) return false;
    values->AddAlreadyReserved(value);
    elements_already_reserved--;
  }
  return true;
}